

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

ExprList * sqlite3ExprListDup(sqlite3 *db,ExprList *p,int flags)

{
  byte bVar1;
  Expr *p_00;
  uint uVar2;
  ExprList *pEVar3;
  Expr *pEVar4;
  char *pcVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  Expr *local_38;
  
  if (p != (ExprList *)0x0) {
    if (((db == (sqlite3 *)0x0) || (p < (ExprList *)(db->lookaside).pStart)) ||
       ((ExprList *)(db->lookaside).pEnd <= p)) {
      uVar2 = (*sqlite3Config.m.xSize)(p);
    }
    else {
      uVar2 = (uint)(db->lookaside).sz;
    }
    pEVar3 = (ExprList *)sqlite3DbMallocRawNN(db,(long)(int)uVar2);
    if (pEVar3 != (ExprList *)0x0) {
      pEVar3->nExpr = p->nExpr;
      if (p->nExpr < 1) {
        return pEVar3;
      }
      local_38 = (Expr *)0x0;
      lVar8 = 8;
      iVar7 = 0;
      do {
        p_00 = *(Expr **)((long)p->a + lVar8 + -8);
        if (p_00 == (Expr *)0x0) {
          pEVar4 = (Expr *)0x0;
        }
        else {
          pEVar4 = exprDup(db,p_00,flags,(u8 **)0x0);
        }
        *(Expr **)((long)pEVar3->a + lVar8 + -8) = pEVar4;
        if ((p_00 != (Expr *)0x0) && (pEVar4 != (Expr *)0x0 && p_00->op == 0xa6)) {
          if (pEVar4->iColumn == 0) {
            local_38 = pEVar4->pRight;
          }
          pEVar4->pLeft = local_38;
        }
        pcVar5 = sqlite3DbStrDup(db,*(char **)((long)&p->a[0].pExpr + lVar8));
        *(char **)((long)&pEVar3->a[0].pExpr + lVar8) = pcVar5;
        pcVar5 = sqlite3DbStrDup(db,*(char **)((long)&p->a[0].zName + lVar8));
        *(char **)((long)&pEVar3->a[0].zName + lVar8) = pcVar5;
        *(undefined1 *)((long)&pEVar3->a[0].zSpan + lVar8) =
             *(undefined1 *)((long)&p->a[0].zSpan + lVar8);
        bVar1 = *(byte *)((long)&pEVar3->a[0].zSpan + lVar8 + 1);
        *(byte *)((long)&pEVar3->a[0].zSpan + lVar8 + 1) = bVar1 & 0xfe;
        bVar6 = *(byte *)((long)&p->a[0].zSpan + lVar8 + 1) & 2;
        *(byte *)((long)&pEVar3->a[0].zSpan + lVar8 + 1) = bVar1 & 0xfc | bVar6;
        *(byte *)((long)&pEVar3->a[0].zSpan + lVar8 + 1) =
             bVar1 & 0xf4 | bVar6 | *(byte *)((long)&p->a[0].zSpan + lVar8 + 1) & 8;
        *(undefined4 *)((long)&pEVar3->a[0].zSpan + lVar8 + 4) =
             *(undefined4 *)((long)&p->a[0].zSpan + lVar8 + 4);
        iVar7 = iVar7 + 1;
        lVar8 = lVar8 + 0x20;
      } while (iVar7 < p->nExpr);
      return pEVar3;
    }
  }
  return (ExprList *)0x0;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListDup(sqlite3 *db, ExprList *p, int flags){
  ExprList *pNew;
  struct ExprList_item *pItem, *pOldItem;
  int i;
  Expr *pPriorSelectCol = 0;
  assert( db!=0 );
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRawNN(db, sqlite3DbMallocSize(db, p));
  if( pNew==0 ) return 0;
  pNew->nExpr = p->nExpr;
  pItem = pNew->a;
  pOldItem = p->a;
  for(i=0; i<p->nExpr; i++, pItem++, pOldItem++){
    Expr *pOldExpr = pOldItem->pExpr;
    Expr *pNewExpr;
    pItem->pExpr = sqlite3ExprDup(db, pOldExpr, flags);
    if( pOldExpr 
     && pOldExpr->op==TK_SELECT_COLUMN
     && (pNewExpr = pItem->pExpr)!=0 
    ){
      assert( pNewExpr->iColumn==0 || i>0 );
      if( pNewExpr->iColumn==0 ){
        assert( pOldExpr->pLeft==pOldExpr->pRight );
        pPriorSelectCol = pNewExpr->pLeft = pNewExpr->pRight;
      }else{
        assert( i>0 );
        assert( pItem[-1].pExpr!=0 );
        assert( pNewExpr->iColumn==pItem[-1].pExpr->iColumn+1 );
        assert( pPriorSelectCol==pItem[-1].pExpr->pLeft );
        pNewExpr->pLeft = pPriorSelectCol;
      }
    }
    pItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pItem->zSpan = sqlite3DbStrDup(db, pOldItem->zSpan);
    pItem->sortOrder = pOldItem->sortOrder;
    pItem->done = 0;
    pItem->bSpanIsTab = pOldItem->bSpanIsTab;
    pItem->bSorterRef = pOldItem->bSorterRef;
    pItem->u = pOldItem->u;
  }
  return pNew;
}